

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O1

size_t rhash_export(rhash ctx,void *out,size_t size)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  *piVar1 = 0x16;
  return 0;
}

Assistant:

RHASH_API size_t rhash_export(rhash ctx, void* out, size_t size)
{
#if !defined(NO_IMPORT_EXPORT)
	size_t export_size;
	size_t i;
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	export_header* header = (export_header*)out;
	unsigned* hash_ids = NULL;
	if (!ctx || (out && size < sizeof(export_header)) || IS_BAD_STATE(ectx->state))
		return export_error_einval();
	export_size = sizeof(export_header) + sizeof(unsigned) * ectx->hash_vector_size;
	if (out != NULL) {
		memset(out, 0, size);
		header->state = ectx->state;
		header->hash_vector_size = (uint16_t)(ectx->hash_vector_size);
		header->flags = (uint16_t)(ectx->flags);
		header->msg_size = ctx->msg_size;
		hash_ids = (unsigned*)(void*)(header + 1);
	}
	for (i = 0; i < ectx->hash_vector_size; i++) {
		void* src_context = ectx->vector[i].context;
		struct rhash_hash_info* hash_info = ectx->vector[i].hash_info;
		unsigned is_special = (hash_info->info->flags & F_SPCEXP);
		size_t item_size;
		if (out != NULL) {
			if (size <= export_size)
				return export_error_einval();
			hash_ids[i] = hash_info->info->hash_id;
			if (is_special) {
				char* dst_item;
				size_t left_size;
				export_size = GET_EXPORT_ALIGNED(export_size);
				dst_item = (char*)out + export_size;
				left_size = size - export_size;
				item_size = rhash_export_alg(hash_info->info->hash_id,
					src_context, dst_item, left_size);
				if (!item_size)
					return export_error_einval();
			} else {
				char* dst_item = (char*)out + export_size;
				item_size = hash_info->context_size;
				if (size < (export_size + item_size))
					return export_error_einval();
				memcpy(dst_item, src_context, item_size);
			}
		} else {
			if (is_special) {
				export_size = GET_EXPORT_ALIGNED(export_size);
				item_size = rhash_export_alg(
					hash_info->info->hash_id, src_context, NULL, 0);
			} else
				item_size = hash_info->context_size;
		}
		export_size += item_size;
	}
	if (export_size < size)
		return export_error_einval();
	return export_size;
#else
	return export_error_einval();
#endif /* !defined(NO_IMPORT_EXPORT) */
}